

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

_Bool aom_img_read(aom_image_t *img,FILE *file)

{
  int iVar1;
  aom_img_fmt_t aVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t __n;
  int iVar6;
  long lVar7;
  uchar *__ptr;
  
  aVar2 = img->fmt;
  lVar7 = 0;
  do {
    __ptr = img->planes[lVar7];
    iVar1 = img->stride[lVar7];
    iVar3 = aom_img_plane_width(img,(int)lVar7);
    iVar4 = aom_img_plane_height(img,(int)lVar7);
    iVar6 = 2;
    if (lVar7 != 2 || img->fmt != AOM_IMG_FMT_NV12) {
      iVar6 = 0;
      if (0 < iVar4) {
        __n = (size_t)(iVar3 << (lVar7 == 1 && img->fmt == AOM_IMG_FMT_NV12));
        do {
          sVar5 = fread(__ptr,2 - (ulong)((aVar2 & 0x800) == AOM_IMG_FMT_NONE),__n,(FILE *)file);
          if (sVar5 != __n) {
            iVar6 = 1;
            goto LAB_0012171f;
          }
          __ptr = __ptr + iVar1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        iVar6 = 0;
      }
    }
LAB_0012171f:
    if (iVar6 != 0) {
      if (iVar6 == 2) {
        return true;
      }
      return false;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

bool aom_img_read(aom_image_t *img, FILE *file) {
  int plane;
  const int bytespp = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    int y;

    // Assuming that for nv12 we read all chroma data at once
    if (img->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (img->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;

    for (y = 0; y < h; ++y) {
      if (fread(buf, bytespp, w, file) != (size_t)w) return false;
      buf += stride;
    }
  }

  return true;
}